

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetDeprecation_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue deprecation;
  cmGeneratorTarget *this_local;
  
  deprecation.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"DEPRECATION",&local_41);
  local_20 = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_20);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetDeprecation() const
{
  // find DEPRECATION property
  if (cmValue deprecation = this->GetProperty("DEPRECATION")) {
    return *deprecation;
  }
  return std::string();
}